

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::clearBufferfv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,float *value)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  deBool dVar4;
  int iVar5;
  bool *pbVar6;
  int *piVar7;
  ConstPixelBufferAccess *pCVar8;
  TextureFormat *pTVar9;
  PixelBufferAccess *this_00;
  PixelBufferAccess *pPVar10;
  InternalError *this_01;
  byte local_1e2;
  byte local_1e1;
  undefined1 local_1d0 [4];
  float depth;
  MultisamplePixelBufferAccess access_1;
  IVec4 local_180;
  undefined1 local_170 [8];
  IVec4 area_1;
  MultisamplePixelBufferAccess depthBuf;
  undefined1 local_124 [16];
  Vec4 local_114;
  int local_104;
  int local_100;
  int s;
  int x;
  int y;
  float local_f0 [2];
  TextureFormat local_e8;
  undefined1 local_e0 [8];
  Vec4 color;
  MultisamplePixelBufferAccess access;
  IVec4 local_7c;
  undefined1 local_6c [8];
  IVec4 area;
  bool maskZero;
  bool maskUsed;
  MultisamplePixelBufferAccess colorBuf;
  IVec4 baseArea;
  float *value_local;
  int drawbuffer_local;
  deUint32 buffer_local;
  ReferenceContext *this_local;
  
  do {
    if ((buffer != 0x1800) && (buffer != 0x1801)) {
      setError(this,0x500);
      return;
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    if (drawbuffer != 0) {
      setError(this,0x501);
      return;
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  if ((this->m_scissorEnabled & 1U) == 0) {
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,0,0,
               0x7fffffff,0x7fffffff);
  }
  else {
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
               &this->m_scissorBox);
  }
  if (buffer == 0x1800) {
    getDrawColorbuffer((MultisamplePixelBufferAccess *)(area.m_data + 3),this);
    pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_1e1 = 1;
    if ((*pbVar6 & 1U) != 0) {
      pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_1e1 = 1;
      if ((*pbVar6 & 1U) != 0) {
        pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_1e1 = 1;
        if ((*pbVar6 & 1U) != 0) {
          pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_1e1 = *pbVar6 ^ 0xff;
        }
      }
    }
    area.m_data[2]._3_1_ = local_1e1 & 1;
    pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
    local_1e2 = 0;
    if ((*pbVar6 & 1U) == 0) {
      pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
      local_1e2 = 0;
      if ((*pbVar6 & 1U) == 0) {
        pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
        local_1e2 = 0;
        if ((*pbVar6 & 1U) == 0) {
          pbVar6 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
          local_1e2 = *pbVar6 ^ 0xff;
        }
      }
    }
    area.m_data[2]._2_1_ = local_1e2 & 1;
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)
               &access.m_access.super_ConstPixelBufferAccess.m_data,
               (MultisamplePixelBufferAccess *)(area.m_data + 3));
    getBufferRect((sglr *)&local_7c,
                  (MultisampleConstPixelBufferAccess *)
                  &access.m_access.super_ConstPixelBufferAccess.m_data);
    intersect((sglr *)local_6c,(IVec4 *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
              &local_7c);
    bVar3 = isEmpty((IVec4 *)local_6c);
    if ((!bVar3) && ((area.m_data[2]._2_1_ & 1) == 0)) {
      piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_6c);
      iVar1 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_6c);
      iVar5 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_6c);
      iVar2 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_6c);
      rr::getSubregion((MultisamplePixelBufferAccess *)(color.m_data + 2),
                       (MultisamplePixelBufferAccess *)(area.m_data + 3),iVar1,iVar5,iVar2,*piVar7);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e0,*value,value[1],value[2],value[3]);
      if ((this->m_sRGBUpdateEnabled & 1U) != 0) {
        pCVar8 = &rr::MultisamplePixelBufferAccess::raw
                            ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                  super_ConstPixelBufferAccess;
        pTVar9 = tcu::ConstPixelBufferAccess::getFormat(pCVar8);
        local_e8 = *pTVar9;
        bVar3 = tcu::isSRGB(local_e8);
        if (bVar3) {
          tcu::linearToSRGB((tcu *)&x,(Vec4 *)local_e0);
          local_e0._0_4_ = x;
          local_e0._4_4_ = y;
          color.m_data[0] = local_f0[0];
          color.m_data[1] = local_f0[1];
        }
      }
      if ((area.m_data[2]._3_1_ & 1) == 0) {
        rr::clear((MultisamplePixelBufferAccess *)(color.m_data + 2),(Vec4 *)local_e0);
      }
      else {
        s = 0;
        while( true ) {
          iVar1 = s;
          pCVar8 = &rr::MultisamplePixelBufferAccess::raw
                              ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                    super_ConstPixelBufferAccess;
          iVar5 = tcu::ConstPixelBufferAccess::getDepth(pCVar8);
          if (iVar5 <= iVar1) break;
          local_100 = 0;
          while( true ) {
            iVar1 = local_100;
            pCVar8 = &rr::MultisamplePixelBufferAccess::raw
                                ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                      super_ConstPixelBufferAccess;
            iVar5 = tcu::ConstPixelBufferAccess::getHeight(pCVar8);
            if (iVar5 <= iVar1) break;
            for (local_104 = 0; iVar1 = local_104,
                iVar5 = rr::MultisamplePixelBufferAccess::getNumSamples
                                  ((MultisamplePixelBufferAccess *)(color.m_data + 2)),
                iVar1 < iVar5; local_104 = local_104 + 1) {
              this_00 = rr::MultisamplePixelBufferAccess::raw
                                  ((MultisamplePixelBufferAccess *)(color.m_data + 2));
              pPVar10 = rr::MultisamplePixelBufferAccess::raw
                                  ((MultisamplePixelBufferAccess *)(color.m_data + 2));
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_124,(int)pPVar10,local_104,local_100);
              tcu::select<float,4>
                        ((tcu *)&local_114,(Vector<float,_4> *)local_e0,
                         (Vector<float,_4> *)local_124,&this->m_colorMask);
              tcu::PixelBufferAccess::setPixel(this_00,&local_114,local_104,local_100,s);
            }
            local_100 = local_100 + 1;
          }
          s = s + 1;
        }
      }
    }
  }
  else {
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || (buffer != 0x1801)) {
        this_01 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this_01,(char *)0x0,"buffer == GL_DEPTH",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                   ,0xdad);
        __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)(area_1.m_data + 2),this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)
               &access_1.m_access.super_ConstPixelBufferAccess.m_data,
               (MultisamplePixelBufferAccess *)(area_1.m_data + 2));
    getBufferRect((sglr *)&local_180,
                  (MultisampleConstPixelBufferAccess *)
                  &access_1.m_access.super_ConstPixelBufferAccess.m_data);
    intersect((sglr *)local_170,(IVec4 *)&colorBuf.m_access.super_ConstPixelBufferAccess.m_data,
              &local_180);
    bVar3 = isEmpty((IVec4 *)local_170);
    if ((!bVar3) && ((this->m_depthMask & 1U) != 0)) {
      piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_170);
      iVar1 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_170);
      iVar5 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_170);
      iVar2 = *piVar7;
      piVar7 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_170);
      rr::getSubregion((MultisamplePixelBufferAccess *)local_1d0,
                       (MultisamplePixelBufferAccess *)(area_1.m_data + 2),iVar1,iVar5,iVar2,*piVar7
                      );
      rr::clearDepth((MultisamplePixelBufferAccess *)local_1d0,*value);
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferfv (deUint32 buffer, int drawbuffer, const float* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_DEPTH, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			Vec4								color		(value[0], value[1], value[2], value[3]);

			if (m_sRGBUpdateEnabled && tcu::isSRGB(access.raw().getFormat()))
				color = tcu::linearToSRGB(color);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_DEPTH);

		rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(depthBuf));

		if (!isEmpty(area) && m_depthMask)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(depthBuf, area.x(), area.y(), area.z(), area.w());
			float								depth		= value[0];

			rr::clearDepth(access, depth);
		}
	}
}